

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O2

void ini_property_remove(ini_t *ini,int section,int property)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ini_internal_property_t *piVar7;
  long lVar8;
  ini_internal_property_t *piVar9;
  byte bVar10;
  
  bVar10 = 0;
  if ((-1 < section && ini != (ini_t *)0x0) && (section < ini->section_count)) {
    iVar5 = ini_internal_property_index(ini,section,property);
    if (iVar5 != -1) {
      piVar7 = ini->properties;
      if (piVar7[iVar5].value_large != (char *)0x0) {
        (**ini->memctx)(piVar7[iVar5].value_large,0,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
        piVar7 = ini->properties;
      }
      if (piVar7[iVar5].name_large != (char *)0x0) {
        (**ini->memctx)(piVar7[iVar5].name_large,0,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
        piVar7 = ini->properties;
      }
      lVar6 = (long)ini->property_count + -1;
      ini->property_count = (int)lVar6;
      piVar9 = piVar7 + lVar6;
      piVar7 = piVar7 + iVar5;
      for (lVar8 = 0xf; lVar8 != 0; lVar8 = lVar8 + -1) {
        cVar1 = piVar9->name[0];
        cVar2 = piVar9->name[1];
        cVar3 = piVar9->name[2];
        cVar4 = piVar9->name[3];
        piVar7->section = piVar9->section;
        piVar7->name[0] = cVar1;
        piVar7->name[1] = cVar2;
        piVar7->name[2] = cVar3;
        piVar7->name[3] = cVar4;
        piVar9 = (ini_internal_property_t *)((long)piVar9 + (ulong)bVar10 * -0x10 + 8);
        piVar7 = (ini_internal_property_t *)((long)piVar7 + (ulong)bVar10 * -0x10 + 8);
      }
    }
  }
  return;
}

Assistant:

void ini_property_remove( ini_t* ini, int section, int property )
    {
    int p;

    if( ini && section >= 0 && section < ini->section_count )
        {
        p = ini_internal_property_index( ini, section, property );
        if( p != INI_NOT_FOUND )
            {
            if( ini->properties[ p ].value_large ) INI_FREE( ini->memctx, ini->properties[ p ].value_large );
            if( ini->properties[ p ].name_large ) INI_FREE( ini->memctx, ini->properties[ p ].name_large );
            ini->properties[ p ] = ini->properties[ --ini->property_count  ];
            return;
            }
        }
    }